

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_ameth.c
# Opt level: O1

int priv_decode_gost(EVP_PKEY *pk,PKCS8_PRIV_KEY_INFO *p8inf)

{
  uchar uVar1;
  uchar *puVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  ASN1_OCTET_STRING *a;
  undefined8 uVar6;
  BIGNUM *pBVar7;
  MASKED_GOST_KEY *a_00;
  ASN1_INTEGER *ai;
  EC_KEY *key;
  long len;
  uchar *p;
  int priv_len;
  uchar *pkey_buf;
  X509_ALGOR *palg;
  ASN1_OBJECT *palg_obj;
  uchar *local_50;
  int local_44;
  uchar *local_40;
  X509_ALGOR *local_38;
  ASN1_OBJECT *local_30;
  
  local_40 = (uchar *)0x0;
  local_50 = (uchar *)0x0;
  local_44 = 0;
  local_38 = (X509_ALGOR *)0x0;
  local_30 = (ASN1_OBJECT *)0x0;
  iVar4 = PKCS8_pkey_get0(&local_30,&local_40,&local_44,&local_38,(PKCS8_PRIV_KEY_INFO *)p8inf);
  if (iVar4 == 0) {
    return 0;
  }
  local_50 = local_40;
  iVar4 = decode_gost_algor_params(pk,(X509_ALGOR *)local_38);
  if (iVar4 == 0) {
    return 0;
  }
  iVar4 = pkey_bits_gost(pk);
  if (iVar4 < 1) {
    iVar4 = 0;
  }
  else {
    iVar5 = pkey_bits_gost(pk);
    iVar4 = iVar5 + 7;
    if (-1 < iVar5) {
      iVar4 = iVar5;
    }
    iVar4 = iVar4 >> 3;
  }
  if (iVar4 == 0) {
    iVar4 = 0x261;
    goto LAB_00112dc9;
  }
  len = (long)local_44;
  if (local_44 % iVar4 == 0) {
    pBVar7 = (BIGNUM *)unmask_priv_key(pk,local_40,iVar4,local_44 / iVar4 + -1);
  }
  else {
    uVar1 = *local_50;
    if (uVar1 == '\x02') {
      ai = d2i_ASN1_INTEGER((ASN1_INTEGER **)0x0,&local_50,len);
      if (ai == (ASN1_INTEGER *)0x0) {
        ERR_GOST_error(0x85,0x72,
                       "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/gost_ameth.c"
                       ,0x276);
        return 0;
      }
      pBVar7 = (BIGNUM *)BN_secure_new();
      pBVar7 = ASN1_INTEGER_to_BN(ai,pBVar7);
      ASN1_INTEGER_free(ai);
    }
    else {
      if (uVar1 == '0') {
        a_00 = d2i_MASKED_GOST_KEY((MASKED_GOST_KEY **)0x0,&local_50,len);
        if (a_00 == (MASKED_GOST_KEY *)0x0) {
          iVar4 = 0x27f;
        }
        else {
          local_44 = a_00->masked_priv_key->length;
          if (local_44 % iVar4 == 0) {
            pBVar7 = (BIGNUM *)
                     unmask_priv_key(pk,a_00->masked_priv_key->data,iVar4,local_44 / iVar4 + -1);
            MASKED_GOST_KEY_free(a_00);
            goto LAB_00112d19;
          }
          MASKED_GOST_KEY_free(a_00);
          iVar4 = 0x286;
        }
LAB_00112cd0:
        ERR_GOST_error(0x85,0x72,
                       "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/gost_ameth.c"
                       ,iVar4);
        bVar3 = false;
        pBVar7 = (BIGNUM *)0x0;
      }
      else {
        if (uVar1 != '\x04') {
          iVar4 = 0x28f;
          goto LAB_00112dc9;
        }
        a = d2i_ASN1_OCTET_STRING((ASN1_OCTET_STRING **)0x0,&local_50,len);
        if ((a == (ASN1_OCTET_STRING *)0x0) ||
           ((iVar4 = a->length, iVar4 != 0x20 && (iVar4 != 0x40)))) {
          ASN1_STRING_free(a);
          iVar4 = 0x26e;
          goto LAB_00112cd0;
        }
        puVar2 = a->data;
        uVar6 = BN_secure_new();
        pBVar7 = (BIGNUM *)BN_lebin2bn(puVar2,iVar4,uVar6);
        ASN1_STRING_free(a);
LAB_00112d19:
        bVar3 = true;
      }
      if (!bVar3) {
        return 0;
      }
    }
  }
  if (pBVar7 != (BIGNUM *)0x0) {
    iVar4 = EVP_PKEY_get_base_id(pk);
    iVar5 = 0;
    if (((iVar4 - 0x3d3U < 2) || (iVar4 == 0x331)) || (iVar4 == 0x32b)) {
      key = (EC_KEY *)EVP_PKEY_get0((EVP_PKEY *)pk);
      if (key == (EC_KEY *)0x0) {
        key = EC_KEY_new();
        iVar4 = EVP_PKEY_get_base_id(pk);
        EVP_PKEY_assign((EVP_PKEY *)pk,iVar4,key);
      }
      iVar4 = EC_KEY_set_private_key(key,pBVar7);
      if (iVar4 != 0) {
        iVar4 = EVP_PKEY_missing_parameters((EVP_PKEY *)pk);
        iVar5 = 1;
        if (iVar4 == 0) {
          iVar5 = gost_ec_compute_public((EC_KEY *)key);
        }
      }
    }
    BN_free(pBVar7);
    return iVar5;
  }
  iVar4 = 0x294;
LAB_00112dc9:
  ERR_GOST_error(0x85,0x72,
                 "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/gost_ameth.c"
                 ,iVar4);
  return 0;
}

Assistant:

static int priv_decode_gost(EVP_PKEY *pk,
                            const PKCS8_PRIV_KEY_INFO *p8inf)
{
    const unsigned char *pkey_buf = NULL, *p = NULL;
    int priv_len = 0;
    BIGNUM *pk_num = NULL;
    int ret = 0;
    const X509_ALGOR *palg = NULL;
    const ASN1_OBJECT *palg_obj = NULL;
    ASN1_INTEGER *priv_key = NULL;
    int expected_key_len;

    if (!PKCS8_pkey_get0(&palg_obj, &pkey_buf, &priv_len, &palg, p8inf))
        return 0;
    p = pkey_buf;
    if (!decode_gost_algor_params(pk, palg)) {
        return 0;
    }

    expected_key_len = pkey_bits_gost(pk) > 0 ? pkey_bits_gost(pk) / 8 : 0;
    if (expected_key_len == 0) {
        GOSTerr(GOST_F_PRIV_DECODE_GOST, EVP_R_DECODE_ERROR);
        return 0;
    }

    if (priv_len % expected_key_len == 0) {
        /* Key is not wrapped but masked */
        pk_num = unmask_priv_key(pk, pkey_buf, expected_key_len,
                                 priv_len / expected_key_len - 1);
    } else if (V_ASN1_OCTET_STRING == *p) {
        /* New format - Little endian octet string */
        ASN1_OCTET_STRING *s = d2i_ASN1_OCTET_STRING(NULL, &p, priv_len);
        if (!s || ((s->length != 32) && (s->length != 64))) {
            ASN1_STRING_free(s);
            GOSTerr(GOST_F_PRIV_DECODE_GOST, EVP_R_DECODE_ERROR);
            return 0;
        }
        pk_num = BN_lebin2bn(s->data, s->length, BN_secure_new());
        ASN1_STRING_free(s);
    } else if (V_ASN1_INTEGER == *p) {
        priv_key = d2i_ASN1_INTEGER(NULL, &p, priv_len);
        if (!priv_key) {
            GOSTerr(GOST_F_PRIV_DECODE_GOST, EVP_R_DECODE_ERROR);
            return 0;
        }
        pk_num = ASN1_INTEGER_to_BN(priv_key, BN_secure_new());
        ASN1_INTEGER_free(priv_key);
    } else if ((V_ASN1_SEQUENCE | V_ASN1_CONSTRUCTED) == *p) {
        MASKED_GOST_KEY *mgk = d2i_MASKED_GOST_KEY(NULL, &p, priv_len);

        if (!mgk) {
            GOSTerr(GOST_F_PRIV_DECODE_GOST, EVP_R_DECODE_ERROR);
            return 0;
        }

        priv_len = mgk->masked_priv_key->length;
        if (priv_len % expected_key_len) {
            MASKED_GOST_KEY_free(mgk);
            GOSTerr(GOST_F_PRIV_DECODE_GOST, EVP_R_DECODE_ERROR);
            return 0;
        }

        pk_num = unmask_priv_key(pk, mgk->masked_priv_key->data,
                                 expected_key_len,
                                 priv_len / expected_key_len - 1);
        MASKED_GOST_KEY_free(mgk);
    } else {
        GOSTerr(GOST_F_PRIV_DECODE_GOST, EVP_R_DECODE_ERROR);
        return 0;
    }

    if (pk_num == NULL) {
        GOSTerr(GOST_F_PRIV_DECODE_GOST, EVP_R_DECODE_ERROR);
        return 0;
    }

    ret = gost_set_priv_key(pk, pk_num);
    BN_free(pk_num);
    return ret;
}